

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Annotation.cpp
# Opt level: O1

void soul::replaceStringLiterals
               (Value *v,SubElementPath *path,StringDictionary *sourceDictionary,
               StringDictionary *destDictionary)

{
  Handle HVar1;
  int iVar2;
  undefined4 extraout_var;
  Structure *pSVar3;
  ulong uVar4;
  Value value;
  SubElementPath local_120;
  SubElementPath local_e8;
  Value local_b0;
  Value local_70;
  
  Value::getSubElement(&local_b0,v,path);
  if (local_b0.type.category == stringLiteral) {
    HVar1 = Value::getStringLiteral(&local_b0);
    iVar2 = (*(sourceDictionary->super_StringDictionary)._vptr_StringDictionary[3])
                      (sourceDictionary,(ulong)HVar1.handle);
    HVar1.handle = (*(destDictionary->super_StringDictionary)._vptr_StringDictionary[2])
                             (destDictionary,CONCAT44(extraout_var,iVar2));
    Value::createStringLiteral(&local_70,HVar1);
    Value::modifySubElementInPlace(v,path,&local_70);
    Value::~Value(&local_70);
  }
  else if ((local_b0.type.category == array) && (local_b0.type.boundingSize != 0)) {
    uVar4 = 0;
    while (uVar4 < (ulong)(long)local_b0.type.boundingSize) {
      SubElementPath::operator+(&local_e8,path,uVar4);
      replaceStringLiterals(v,&local_e8,sourceDictionary,destDictionary);
      local_e8.indexes.numActive = 0;
      if (4 < local_e8.indexes.numAllocated) {
        if (local_e8.indexes.items != (uint64_t *)0x0) {
          operator_delete__(local_e8.indexes.items);
        }
        local_e8.indexes.items = local_e8.indexes.space;
        local_e8.indexes.numAllocated = 4;
      }
      uVar4 = uVar4 + 1;
      if (local_b0.type.category != array) {
        throwInternalCompilerError("isArray()","getArraySize",0x128);
      }
    }
  }
  else if (local_b0.type.category == structure) {
    for (uVar4 = 0; pSVar3 = Type::getStructRef(&local_b0.type), uVar4 < (pSVar3->members).numActive
        ; uVar4 = uVar4 + 1) {
      SubElementPath::operator+(&local_120,path,uVar4);
      replaceStringLiterals(v,&local_120,sourceDictionary,destDictionary);
      local_120.indexes.numActive = 0;
      if (4 < local_120.indexes.numAllocated) {
        if (local_120.indexes.items != (uint64_t *)0x0) {
          operator_delete__(local_120.indexes.items);
        }
        local_120.indexes.items = local_120.indexes.space;
        local_120.indexes.numAllocated = 4;
      }
    }
  }
  Value::~Value(&local_b0);
  return;
}

Assistant:

static void replaceStringLiterals (Value& v, SubElementPath path, const StringDictionary& sourceDictionary, StringDictionary& destDictionary)
{
    auto value = v.getSubElement (path);

    if (value.getType().isStringLiteral())
    {
        auto s = sourceDictionary.getStringForHandle (value.getStringLiteral());
        v.modifySubElementInPlace (path, Value::createStringLiteral (destDictionary.getHandleForString (s)));
    }
    else if (value.getType().isFixedSizeArray())
    {
        for (size_t i = 0; i < value.getType().getArraySize(); ++i)
             replaceStringLiterals (v, path + i, sourceDictionary, destDictionary);
    }
    else if (value.getType().isStruct())
    {
        for (size_t i = 0; i < value.getType().getStructRef().getNumMembers(); ++i)
             replaceStringLiterals (v, path + i, sourceDictionary, destDictionary);
    }
}